

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_chroma_horz
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  
  auVar2 = _DAT_00178970;
  auVar1 = _DAT_00178960;
  if (0 < ht) {
    iVar4 = 0;
    do {
      if (0 < wd) {
        lVar6 = 0;
        do {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(pu1_src + lVar6 + -2);
          in_XMM3 = pmovsxbd(in_XMM3,*(undefined4 *)pi1_coeff);
          auVar8 = pshufb(auVar7,auVar2);
          auVar8 = pmaddwd(auVar8,in_XMM3);
          auVar8 = phaddd(auVar8,auVar8);
          auVar8 = phaddd(auVar8,auVar8);
          iVar3 = auVar8._0_2_ * 0x400 + 0x8000;
          if (iVar3 >> 0x10 < 1) {
            iVar3 = 0;
          }
          iVar3 = iVar3 >> 0x10;
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          auVar7 = pshufb(auVar7,auVar1);
          auVar7 = pmaddwd(auVar7,in_XMM3);
          auVar7 = phaddd(auVar7,auVar7);
          auVar7 = phaddd(auVar7,auVar7);
          iVar5 = auVar7._0_2_ * 0x400 + 0x8000;
          if (iVar5 >> 0x10 < 1) {
            iVar5 = 0;
          }
          iVar5 = iVar5 >> 0x10;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar6] = (UWORD8)iVar3;
          pu1_dst[lVar6 + 1] = (UWORD8)iVar5;
          lVar6 = lVar6 + 2;
        } while (lVar6 < wd * 2);
      }
      pu1_src = pu1_src + src_strd;
      pu1_dst = pu1_dst + dst_strd;
      iVar4 = iVar4 + 1;
    } while (iVar4 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz(UWORD8 *pu1_src,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 dst_strd,
                                  WORD8 *pi1_coeff,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp_u, i2_tmp_v;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i2_tmp_u = 0;
            i2_tmp_v = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp_u += pi1_coeff[i] * pu1_src[col + (i - 1) * 2];
                i2_tmp_v += pi1_coeff[i] * pu1_src[col + 1 + (i - 1) * 2];
            }

            i2_tmp_u = (i2_tmp_u + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_u = CLIP_U8(i2_tmp_u);
            i2_tmp_v = (i2_tmp_v + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_v = CLIP_U8(i2_tmp_v);


            pu1_dst[col] = (UWORD8)i2_tmp_u;
            pu1_dst[col + 1] = (UWORD8)i2_tmp_v;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }
}